

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O0

string * __thiscall
llbuild::commands::util::escapedString_abi_cxx11_
          (string *__return_storage_ptr__,util *this,StringRef str)

{
  byte C;
  char cVar1;
  int iVar2;
  raw_ostream *prVar3;
  uint local_64;
  undefined1 local_60 [3];
  char c;
  uint i;
  raw_string_ostream resultStream;
  undefined1 local_28 [8];
  StringRef str_local;
  string *result;
  
  str_local.Data = str.Data;
  resultStream.OS._7_1_ = 0;
  local_28 = (undefined1  [8])this;
  str_local.Length = (size_t)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  llvm::raw_string_ostream::raw_string_ostream
            ((raw_string_ostream *)local_60,__return_storage_ptr__);
  for (local_64 = 0; (char *)(ulong)local_64 < str_local.Data; local_64 = local_64 + 1) {
    C = llvm::StringRef::operator[]((StringRef *)local_28,(ulong)local_64);
    if (C == 0x22) {
      llvm::raw_ostream::operator<<((raw_ostream *)local_60,"\\\"");
    }
    else {
      iVar2 = isprint((int)(char)C);
      if (iVar2 == 0) {
        if (C == 10) {
          llvm::raw_ostream::operator<<((raw_ostream *)local_60,"\\n");
        }
        else {
          prVar3 = llvm::raw_ostream::operator<<((raw_ostream *)local_60,"\\x");
          cVar1 = hexdigit((int)(uint)C >> 4);
          prVar3 = llvm::raw_ostream::operator<<(prVar3,cVar1);
          cVar1 = hexdigit(C & 0xf);
          llvm::raw_ostream::operator<<(prVar3,cVar1);
        }
      }
      else {
        llvm::raw_ostream::operator<<((raw_ostream *)local_60,C);
      }
    }
  }
  llvm::raw_ostream::flush((raw_ostream *)local_60);
  resultStream.OS._7_1_ = 1;
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_60);
  if ((resultStream.OS._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string util::escapedString(StringRef str) {
  std::string result;
  llvm::raw_string_ostream resultStream(result);
  for (unsigned i = 0; i < str.size(); ++i) {
    char c = str[i];
    if (c == '"') {
      resultStream << "\\\"";
    } else if (isprint(c)) {
      resultStream << c;
    } else if (c == '\n') {
      resultStream << "\\n";
    } else {
      resultStream << "\\x"
             << hexdigit(((unsigned char) c >> 4) & 0xF)
             << hexdigit((unsigned char) c & 0xF);
    }
  }
  resultStream.flush();
  return result;
}